

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::PolygonNumSamplesCase::renderPattern(PolygonNumSamplesCase *this)

{
  float fVar1;
  float fVar2;
  Vector<float,_4> local_48;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  float local_20;
  float local_1c;
  float angle1;
  float angle0;
  int i;
  int numTriangles;
  PolygonNumSamplesCase *this_local;
  
  angle0 = 3.50325e-44;
  _i = this;
  for (angle1 = 0.0; (int)angle1 < 0x19; angle1 = (float)((int)angle1 + 1)) {
    local_1c = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
               ((float)(int)angle1 * 6.2831855) / 25.0;
    local_20 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
               (((float)(int)angle1 + 0.5) * 6.2831855) / 25.0;
    tcu::Vector<float,_2>::Vector(&local_28,0.0,0.0);
    fVar1 = ::deFloatCos(local_1c);
    fVar2 = ::deFloatSin(local_1c);
    tcu::Vector<float,_2>::Vector(&local_30,fVar1 * 0.95,fVar2 * 0.95);
    fVar1 = ::deFloatCos(local_20);
    fVar2 = ::deFloatSin(local_20);
    tcu::Vector<float,_2>::Vector(&local_38,fVar1 * 0.95,fVar2 * 0.95);
    tcu::Vector<float,_4>::Vector(&local_48,1.0);
    MultisampleCase::renderTriangle((MultisampleCase *)this,&local_28,&local_30,&local_38,&local_48)
    ;
  }
  return;
}

Assistant:

void PolygonNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several triangles with edges at different angles.

	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles + 0.001f*(float)m_currentIteration;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles + 0.001f*(float)m_currentIteration;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(1.0f));
	}
}